

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pIVar2 = GImGui;
  uVar6 = (ulong)(flags & 1);
  uVar4 = data_type & 0xfffffffe;
  bVar7 = uVar4 == 4;
  bVar5 = power != 1.0;
  fVar15 = (&(bb->Min).x)[uVar6];
  fVar10 = (&(bb->Max).x)[uVar6];
  fVar17 = (fVar10 - fVar15) + -4.0;
  fVar14 = (GImGui->Style).GrabMinSize;
  fVar13 = v_max - v_min;
  fVar16 = (float)(~-(uint)(v_min < v_max) & (uint)(v_min - v_max) |
                  -(uint)(v_min < v_max) & (uint)fVar13);
  if ((uVar4 != 4) && (0.0 <= fVar16)) {
    fVar12 = fVar17 / (fVar16 + 1.0);
    uVar8 = -(uint)(fVar14 <= fVar12);
    fVar14 = (float)(~uVar8 & (uint)fVar14 | (uint)fVar12 & uVar8);
  }
  if (fVar17 <= fVar14) {
    fVar14 = fVar17;
  }
  if ((!bVar5 || !bVar7) || 0.0 <= v_min * v_max) {
    fVar12 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    uVar8 = -(uint)(-v_min <= v_min);
    fVar12 = powf((float)(uVar8 & (uint)v_min | ~uVar8 & (uint)-v_min),1.0 / power);
    uVar8 = -(uint)(-v_max <= v_max);
    fVar9 = powf((float)(uVar8 & (uint)v_max | ~uVar8 & (uint)-v_max),1.0 / power);
    fVar12 = fVar12 / (fVar9 + fVar12);
  }
  fVar15 = fVar15 + 2.0 + fVar14 * 0.5;
  if (pIVar2->ActiveId != id) {
    bVar5 = false;
    goto LAB_00151c6d;
  }
  if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
    IVar11 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar17 = IVar11.x;
    if (uVar6 != 0) {
      fVar17 = -IVar11.y;
    }
    if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if ((fVar17 != 0.0) || (NAN(fVar17))) {
      fVar9 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar12);
      if ((uVar4 != 4) ||
         (iVar3 = ImParseFormatPrecision(format,3), (bool)(~(bVar5 && bVar7) & iVar3 < 1))) {
        if ((ABS(fVar16) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar17 = *(float *)(&DAT_0018cb58 + (ulong)(fVar17 < 0.0) * 4) / fVar16;
        }
        else {
          fVar17 = fVar17 / 100.0;
        }
      }
      else {
        fVar17 = fVar17 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar17 = fVar17 / 10.0;
        }
      }
      uVar8 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      fVar16 = (float)(~uVar8 & (uint)fVar17 | (uint)(fVar17 * 10.0) & uVar8);
      if (((fVar9 < 1.0) || (fVar16 <= 0.0)) && ((0.0 < fVar9 || (0.0 <= fVar16)))) {
        fVar9 = fVar9 + fVar16;
        fVar16 = 1.0;
        if (fVar9 <= 1.0) {
          fVar16 = fVar9;
        }
        fVar9 = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar16);
        goto LAB_00151884;
      }
      bVar1 = false;
      goto LAB_00151b19;
    }
    bVar1 = false;
    fVar9 = 0.0;
  }
  else {
    fVar9 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] == false) {
        ClearActiveID();
        fVar9 = 0.0;
        bVar1 = false;
      }
      else {
        if (0.0 < fVar17 - fVar14) {
          fVar16 = (*(float *)((pIVar2->IO).MouseDown + uVar6 * 4 + -8) - fVar15) /
                   (fVar17 - fVar14);
          fVar9 = 1.0;
          if (fVar16 <= 1.0) {
            fVar9 = fVar16;
          }
          fVar9 = (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar9);
        }
        if (uVar6 != 0) {
          fVar9 = 1.0 - fVar9;
        }
LAB_00151884:
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
LAB_00151b19:
  if (bVar1) {
    if (bVar5 && bVar7) {
      if (fVar12 <= fVar9) {
        uVar4 = -(uint)(1e-06 < ABS(fVar12 + -1.0));
        fVar13 = powf((float)(~uVar4 & (uint)fVar9 |
                             (uint)((fVar9 - fVar12) / (1.0 - fVar12)) & uVar4),power);
        fVar16 = (float)(-(uint)(0.0 <= v_min) & (uint)v_min);
        fVar16 = (v_max - fVar16) * fVar13 + fVar16;
      }
      else {
        fVar13 = powf(1.0 - fVar9 / fVar12,power);
        fVar16 = v_max;
        if (0.0 <= v_max) {
          fVar16 = 0.0;
        }
        fVar16 = (v_min - fVar16) * fVar13 + fVar16;
      }
    }
    else {
      if (uVar4 == 4) {
        fVar16 = fVar13 * fVar9;
      }
      else {
        fVar13 = fVar13 * fVar9;
        fVar16 = fVar13 + 0.5;
        if (fVar13 + 0.5 <= fVar13) {
          fVar16 = fVar13;
        }
      }
      fVar16 = fVar16 + v_min;
    }
    fVar16 = RoundScalarWithFormatT<float,float>(format,data_type,fVar16);
    fVar13 = *v;
    if ((fVar13 != fVar16) || (NAN(fVar13) || NAN(fVar16))) {
      *v = fVar16;
      bVar5 = true;
    }
    else {
      bVar5 = (bool)(-(fVar16 != fVar13) & 1);
    }
  }
  else {
    bVar5 = false;
  }
LAB_00151c6d:
  fVar13 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar12);
  if (uVar6 != 0) {
    fVar13 = 1.0 - fVar13;
  }
  fVar15 = (((fVar10 + -2.0) - fVar14 * 0.5) - fVar15) * fVar13 + fVar15;
  if (uVar6 == 0) {
    fVar13 = -fVar14 * 0.5 + fVar15;
    fVar16 = fVar14 * 0.5 + fVar15;
    fVar10 = (bb->Min).y + 2.0;
    fVar15 = (bb->Max).y + -2.0;
  }
  else {
    fVar13 = (bb->Min).x + 2.0;
    fVar16 = (bb->Max).x + -2.0;
    fVar10 = -fVar14 * 0.5 + fVar15;
    fVar15 = fVar14 * 0.5 + fVar15;
  }
  (out_grab_bb->Min).x = fVar13;
  (out_grab_bb->Min).y = fVar10;
  (out_grab_bb->Max).x = fVar16;
  (out_grab_bb->Max).y = fVar15;
  return bVar5;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}